

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O2

int induced_align(d_level *dlev,int pct)

{
  uint uVar1;
  d_flags dVar2;
  s_level *psVar3;
  int iVar4;
  
  psVar3 = Is_special(dlev);
  if ((psVar3 == (s_level *)0x0) || (((uint)psVar3->flags & 0x70) == 0)) {
LAB_0018826b:
    if (((uint)dungeons[dlev->dnum].flags & 0x70) != 0) {
      uVar1 = mt_random();
      if ((int)(uVar1 % 100) < pct) {
        dVar2 = dungeons[dlev->dnum].flags;
        goto LAB_0018829d;
      }
    }
    uVar1 = mt_random();
    iVar4 = (uVar1 % 3) * 0x1000000 + -0x1000000;
    uVar1 = 4;
    if (iVar4 != 0x1000000) {
      uVar1 = (iVar4 >> 0x18) + 2;
    }
  }
  else {
    uVar1 = mt_random();
    if (pct <= (int)(uVar1 % 100)) goto LAB_0018826b;
    dVar2 = psVar3->flags;
LAB_0018829d:
    uVar1 = (uint)dVar2 >> 4 & 7;
  }
  return uVar1;
}

Assistant:

int induced_align(const d_level *dlev, int pct)
{
	s_level	*lev = Is_special(dlev);
	aligntyp al;

	if (lev && lev->flags.align)
		if (rn2(100) < pct) return lev->flags.align;

	if (dungeons[dlev->dnum].flags.align)
		if (rn2(100) < pct) return dungeons[dlev->dnum].flags.align;

	al = rn2(3) - 1;
	return Align2amask(al);
}